

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_helper_unpolar<ExchCXX::BuiltinPC07OPT_K>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  double in_RCX;
  int in_EDI;
  double in_R8;
  double in_R9;
  double lapl_i;
  int32_t i;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    mgga_screening_interface<ExchCXX::BuiltinPC07OPT_K>::eval_exc_unpolar
              (in_RCX,in_R8,in_R9,(double)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
               *(double **)((long)in_RCX + (long)iVar1 * 8));
  }
  return;
}

Assistant:

MGGA_EXC_GENERATOR( host_eval_exc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const double lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    traits::eval_exc_unpolar( rho[i], sigma[i], lapl_i, tau[i], eps[i] );

  }

}